

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O1

void monitor(void)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char *string;
  ushort uVar6;
  
  uVar1 = getcolor();
  setpalette('\v','\b');
  setpalette('\f','\a');
  setpalette('\r','\0');
  setpalette('\x0e','\x03');
  setpalette('\x0f','\x04');
  setbkcolor(0xc);
  cleardevice();
  settextstyle(0,0,3);
  setcolor(0xf);
  outtextxy(10,10,"Options");
  setcolor(0xb);
  outtextxy(0xc,0xc,"Options");
  setcolor(0xe);
  outtextxy(0xe,0xe,"Options");
  setcolor(0xd);
  settextstyle(0,0,1);
  outtextxy(0,0x3c,"X : Quit Softbeeb");
  outtextxy(0,0x46,"B : Simulate Break Key (Reset)");
  outtextxy(0,0x50,"R : Redraw Graphics Screen");
  outtextxy(0,0x5a,"S : PC Speaker Sound Emulation");
  outtextxy(0,0x6e,"Press the key of your choice");
  outtextxy(0x32,200," Press `return\' to continue the Emulation");
  while( true ) {
    iVar2 = kbhit();
    if (iVar2 == 0) break;
    coniogetch();
  }
  uVar3 = 0;
  do {
    string = "Do you want sound? Y/N";
    iVar2 = tolower(uVar3);
    if (iVar2 < 0x73) {
      if (iVar2 == 0x62) {
        setcolor(0xf);
        outtextxy(0,0x131,"Press Y to confirm reset");
        iVar2 = coniogetch();
        iVar2 = tolower(iVar2);
        string = "Press Y to confirm reset";
        if (iVar2 == 0x79) {
          pc = 0xd9cd;
          string = "Press Y to confirm reset";
        }
        goto LAB_0010b932;
      }
      if (iVar2 == 0x72) {
        string = "Redrawing Graphics Screen...";
        if (teletext == '\0') {
          setcolor(0xf);
          outtextxy(0,0x131,"Redrawing Graphics Screen...");
          uVar5 = (uint)screen_start;
          setactivepage(0);
          uVar3 = (uint)ram_screen_start;
          if (-1 < (short)ram_screen_start) {
            uVar6 = 1;
            do {
              uVar4 = uVar5 & 0xffff;
              if ((uVar5 & 0xffff) == 0x8000) {
                uVar4 = uVar3;
              }
              (*screen_byte_P)(RAM[(ushort)uVar4],(ushort)uVar4);
              uVar5 = uVar4 + 1;
              update_cursor();
              uVar3 = (uint)ram_screen_start;
              uVar4 = (uint)uVar6;
              uVar6 = uVar6 + 1;
            } while ((int)uVar4 < (int)(0x8000 - uVar3));
          }
          setactivepage(1);
          string = "Redrawing Graphics Screen...";
        }
        goto LAB_0010b932;
      }
    }
    else {
      if (iVar2 == 0x73) {
        setcolor(0xf);
        outtextxy(0,0x131,"Do you want sound? Y/N");
        iVar2 = coniogetch();
        iVar2 = tolower(iVar2);
        if (iVar2 == 0x79) {
          soundyesno = '\x01';
          update_sound();
        }
        else {
          soundyesno = '\0';
          nosound();
        }
      }
      else {
        if (iVar2 != 0x78) goto LAB_0010b95c;
        setcolor(0xf);
        string = "Are you sure you want to quit? Y/N";
        outtextxy(0,0x131,"Are you sure you want to quit? Y/N");
        iVar2 = coniogetch();
        iVar2 = tolower(iVar2);
        if (iVar2 == 0x79) {
          quit_prog();
          return;
        }
      }
LAB_0010b932:
      setcolor(0xc);
      outtextxy(0,0x131,string);
      setcolor(0xd);
    }
LAB_0010b95c:
    uVar3 = coniogetch();
    uVar3 = uVar3 & 0xffff;
    if (uVar3 == 0xd) {
      setbkcolor(0);
      setcolor((uint)uVar1);
      return;
    }
  } while( true );
}

Assistant:

void monitor(void) {
    uint init_colour;
    uint c = 0;  // misc counters
    uint d = 0;  // misc counters

    init_colour = getcolor();

    setpalette(11, EGA_LIGHTRED);
    setpalette(12, EGA_BLACK);
    setpalette(13, EGA_WHITE);
    setpalette(14, EGA_BLUE);
    setpalette(15, EGA_YELLOW);
    setbkcolor(BLACK);
    cleardevice();

    settextstyle(DEFAULT_FONT, HORIZ_DIR, 3);
    setcolor(YELLOW);
    outtextxy(10, 10, "Options");
    setcolor(RED);
    outtextxy(12, 12, "Options");
    setcolor(BLUE);
    outtextxy(14, 14, "Options");

    setcolor(WHITE);

    settextstyle(DEFAULT_FONT, HORIZ_DIR, 1);

/* The area 0,300,0,350 is to be left clear for further option prompts */

/*****************************************
******************************************
*****************************************/

    outtextxy(0, 60, "X : Quit Softbeeb");
    outtextxy(0, 70, "B : Simulate Break Key (Reset)");
    outtextxy(0, 80, "R : Redraw Graphics Screen");
    outtextxy(0, 90, "S : PC Speaker Sound Emulation");
    outtextxy(0, 110, "Press the key of your choice");
    outtextxy(50, 200, " Press `return' to continue the Emulation");

    while (kbhit()) coniogetch();

    for (; c != '\r'; c = coniogetch()) {
        switch (tolower(c)) {

            case 'x':
                setcolor(YELLOW);
                outtextxy(0, 305, "Are you sure you want to quit? Y/N");
                if (tolower(coniogetch()) == 'y') quit_prog();
                else {
                    setcolor(BLACK);
                    outtextxy(0, 305, "Are you sure you want to quit? Y/N");
                }
                setcolor(WHITE);
                break;
            case 'r':
                if (!teletext) {
                    setcolor(YELLOW);
                    outtextxy(0, 305, "Redrawing Graphics Screen...");
                    d = screen_start;
                    setactivepage(0);
                    for (c = 0; c < (0x8000 - ram_screen_start); c++) {
                        if (d == 0x8000) d = ram_screen_start;
                        screen_byte_P(RAM[d], d);
                        d++;
                        update_cursor();
                    }
                    setactivepage(1);
                }
                setcolor(BLACK);
                outtextxy(0, 305, "Redrawing Graphics Screen...");
                setcolor(WHITE);
                break;
            case 'b':
                setcolor(YELLOW);
                outtextxy(0, 305, "Press Y to confirm reset");
                if (tolower(coniogetch()) == 'y')
                    pc = 0xD9CD;
                setcolor(BLACK);
                outtextxy(0, 305, "Press Y to confirm reset");
                setcolor(WHITE);
                break;

            case 's':
                setcolor(YELLOW);
                outtextxy(0, 305, "Do you want sound? Y/N");
                if (tolower(coniogetch()) == 'y') {
                    soundyesno = 1;
                    update_sound();
                }
                else {
                    soundyesno = 0;
                    nosound();
                }
                setcolor(BLACK);
                outtextxy(0, 305, "Do you want sound? Y/N");
                setcolor(WHITE);
                break;


        }


    }
    setbkcolor(0);
    setcolor(init_colour);
}